

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeTestResultParser.cpp
# Opt level: O1

NumericValue xe::getNumericValue(string *value)

{
  pointer pcVar1;
  long lVar2;
  undefined8 uVar3;
  ulong uVar4;
  int whitespaceCount;
  int iVar5;
  int whitespaceCount_1;
  int iVar6;
  NumericValue NVar7;
  deInt64 val;
  istringstream s;
  allocator<char> local_1b9;
  anon_union_8_2_07d0b834_for_m_value local_1b8 [2];
  long local_1a8 [2];
  istringstream local_198 [120];
  ios_base local_120 [264];
  
  iVar5 = 0;
  lVar2 = std::__cxx11::string::find((char)value,0x2e);
  if (lVar2 == -1) {
    iVar6 = 0;
    lVar2 = std::__cxx11::string::find((char)value,0x65);
    if (lVar2 == -1) {
      pcVar1 = (value->_M_dataplus)._M_p;
      while( true ) {
        uVar4 = (ulong)(byte)pcVar1[iVar6];
        if ((0x20 < uVar4) || ((0x100002600U >> (uVar4 & 0x3f) & 1) == 0)) break;
        iVar6 = iVar6 + 1;
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_1b8,pcVar1 + iVar6,&local_1b9);
      std::__cxx11::istringstream::istringstream(local_198,(string *)local_1b8,_S_in);
      if ((long *)local_1b8[0].int64 != local_1a8) {
        operator_delete((void *)local_1b8[0],local_1a8[0] + 1);
      }
      std::istream::_M_extract<long>((long *)local_198);
      std::__cxx11::istringstream::~istringstream(local_198);
      std::ios_base::~ios_base(local_120);
      uVar3 = 1;
      goto LAB_00110946;
    }
  }
  pcVar1 = (value->_M_dataplus)._M_p;
  while( true ) {
    uVar4 = (ulong)(byte)pcVar1[iVar5];
    if ((0x20 < uVar4) || ((0x100002600U >> (uVar4 & 0x3f) & 1) == 0)) break;
    iVar5 = iVar5 + 1;
  }
  local_1b8[0].float64 = atof(pcVar1 + iVar5);
  uVar3 = 2;
LAB_00110946:
  NVar7.m_value.int64 = local_1b8[0].int64;
  NVar7._0_8_ = uVar3;
  return NVar7;
}

Assistant:

static ri::NumericValue getNumericValue (const std::string& value)
{
	const bool	isFloat		= value.find('.') != std::string::npos || value.find('e') != std::string::npos;

	if (isFloat)
	{
		const double num = toDouble(stripLeadingWhitespace(value.c_str()));
		return ri::NumericValue(num);
	}
	else
	{
		const deInt64 num = toInt64(stripLeadingWhitespace(value.c_str()));
		return ri::NumericValue(num);
	}
}